

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.cc
# Opt level: O2

void __thiscall trng::yarn4::yarn4(yarn4 *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *(long *)(this->P).a = P.a._0_8_;
  *(long *)((this->P).a + 2) = P.a._8_8_;
  mrg_status<int,_4,_trng::yarn4>::mrg_status(&this->S);
  iVar1 = (int)((long)s % 0x7fffffff);
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < (long)s % 0x7fffffff) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  (this->S).r[3] = 1;
  return;
}

Assistant:

yarn4::yarn4(unsigned long s, yarn4::parameter_type P) : P{P} { seed(s); }